

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O3

void ex_atan2(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  t_float *ptVar1;
  t_float *ptVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  t_float *ptVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  char *fmt;
  long lVar10;
  float fVar11;
  double dVar12;
  double __x;
  undefined1 auVar13 [16];
  int iVar16;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar22;
  undefined1 auVar21 [16];
  
  lVar8 = argv->ex_type;
  if (lVar8 - 0xeU < 2) {
    if (optr->ex_type == 0xf) {
      ptVar6 = (optr->ex_cont).v_vec;
    }
    else {
      if (optr->ex_type == 0xe) {
LAB_0019fef8:
        post("expr~: Int. error %d",0x315);
        abort();
      }
      optr->ex_type = 0xf;
      ptVar6 = (t_float *)malloc((long)e->exp_vsize << 2);
      (optr->ex_cont).v_vec = ptVar6;
    }
    ptVar2 = (argv->ex_cont).v_vec;
    lVar8 = argv[1].ex_type;
    if (lVar8 - 0xeU < 2) {
      iVar16 = e->exp_vsize;
      if (iVar16 == 0) {
        return;
      }
      ptVar1 = argv[1].ex_cont.v_vec;
      lVar8 = 0;
      do {
        dVar12 = atan2((double)ptVar2[lVar8],(double)ptVar1[lVar8]);
        ptVar6[lVar8] = (float)dVar12;
        lVar8 = lVar8 + 1;
      } while (iVar16 != (int)lVar8);
      return;
    }
    if (lVar8 == 2) {
      iVar16 = e->exp_vsize;
      if (iVar16 == 0) {
        return;
      }
      fVar11 = argv[1].ex_cont.v_flt;
      lVar8 = 0;
      do {
        dVar12 = atan2((double)ptVar2[lVar8],(double)fVar11);
        ptVar6[lVar8] = (float)dVar12;
        lVar8 = lVar8 + 1;
      } while (iVar16 != (int)lVar8);
      return;
    }
    if (lVar8 == 1) {
      iVar16 = e->exp_vsize;
      if (iVar16 == 0) {
        return;
      }
      lVar8 = argv[1].ex_cont.v_int;
      lVar10 = 0;
      do {
        dVar12 = atan2((double)ptVar2[lVar10],(double)lVar8);
        ptVar6[lVar10] = (float)dVar12;
        lVar10 = lVar10 + 1;
      } while (iVar16 != (int)lVar10);
      return;
    }
  }
  else if (lVar8 == 2) {
    lVar8 = argv[1].ex_type;
    if (lVar8 - 0xeU < 2) {
      if (optr->ex_type != 0xf) {
        if (optr->ex_type == 0xe) goto LAB_0019fef8;
        optr->ex_type = 0xf;
        ptVar6 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar6;
      }
      iVar16 = e->exp_vsize;
      if (iVar16 == 0) {
        return;
      }
      ptVar6 = (optr->ex_cont).v_vec;
      ptVar2 = argv[1].ex_cont.v_vec;
      fVar11 = (argv->ex_cont).v_flt;
      lVar8 = 0;
      do {
        dVar12 = atan2((double)fVar11,(double)ptVar2[lVar8]);
        ptVar6[lVar8] = (float)dVar12;
        lVar8 = lVar8 + 1;
      } while (iVar16 != (int)lVar8);
      return;
    }
    if (lVar8 == 2) {
      if (optr->ex_type == 0xf) {
        ptVar6 = (optr->ex_cont).v_vec;
        dVar12 = atan2((double)(argv->ex_cont).v_flt,(double)argv[1].ex_cont.v_flt);
        auVar5 = _DAT_001b53a0;
        auVar4 = _DAT_001b5390;
        auVar3 = _DAT_001b5380;
        uVar7 = (ulong)(uint)e->exp_vsize;
        if (uVar7 == 0) {
          return;
        }
        fVar11 = (float)dVar12;
        lVar8 = uVar7 - 1;
        auVar21._8_4_ = (int)lVar8;
        auVar21._0_8_ = lVar8;
        auVar21._12_4_ = (int)((ulong)lVar8 >> 0x20);
        uVar9 = 0;
        auVar21 = auVar21 ^ _DAT_001b53a0;
        do {
          auVar20._8_4_ = (int)uVar9;
          auVar20._0_8_ = uVar9;
          auVar20._12_4_ = (int)(uVar9 >> 0x20);
          auVar14 = (auVar20 | auVar4) ^ auVar5;
          iVar16 = auVar21._4_4_;
          if ((bool)(~(auVar14._4_4_ == iVar16 && auVar21._0_4_ < auVar14._0_4_ ||
                      iVar16 < auVar14._4_4_) & 1)) {
            ptVar6[uVar9] = fVar11;
          }
          if ((auVar14._12_4_ != auVar21._12_4_ || auVar14._8_4_ <= auVar21._8_4_) &&
              auVar14._12_4_ <= auVar21._12_4_) {
            ptVar6[uVar9 + 1] = fVar11;
          }
          auVar20 = (auVar20 | auVar3) ^ auVar5;
          iVar22 = auVar20._4_4_;
          if (iVar22 <= iVar16 && (iVar22 != iVar16 || auVar20._0_4_ <= auVar21._0_4_)) {
            ptVar6[uVar9 + 2] = fVar11;
            ptVar6[uVar9 + 3] = fVar11;
          }
          uVar9 = uVar9 + 4;
        } while ((uVar7 + 3 & 0xfffffffffffffffc) != uVar9);
        return;
      }
      optr->ex_type = 2;
      dVar12 = (double)(argv->ex_cont).v_flt;
LAB_0019fed7:
      __x = (double)argv[1].ex_cont.v_flt;
LAB_0019fedc:
      dVar12 = atan2(dVar12,__x);
      (optr->ex_cont).v_flt = (float)dVar12;
      return;
    }
    if (lVar8 == 1) {
      if (optr->ex_type == 0xf) {
        ptVar6 = (optr->ex_cont).v_vec;
        dVar12 = atan2((double)(argv->ex_cont).v_flt,(double)argv[1].ex_cont.v_int);
        auVar5 = _DAT_001b53a0;
        auVar4 = _DAT_001b5390;
        auVar3 = _DAT_001b5380;
        uVar7 = (ulong)(uint)e->exp_vsize;
        if (uVar7 == 0) {
          return;
        }
        fVar11 = (float)dVar12;
        lVar8 = uVar7 - 1;
        auVar14._8_4_ = (int)lVar8;
        auVar14._0_8_ = lVar8;
        auVar14._12_4_ = (int)((ulong)lVar8 >> 0x20);
        uVar9 = 0;
        auVar14 = auVar14 ^ _DAT_001b53a0;
        do {
          auVar18._8_4_ = (int)uVar9;
          auVar18._0_8_ = uVar9;
          auVar18._12_4_ = (int)(uVar9 >> 0x20);
          auVar21 = (auVar18 | auVar4) ^ auVar5;
          iVar16 = auVar14._4_4_;
          if ((bool)(~(auVar21._4_4_ == iVar16 && auVar14._0_4_ < auVar21._0_4_ ||
                      iVar16 < auVar21._4_4_) & 1)) {
            ptVar6[uVar9] = fVar11;
          }
          if ((auVar21._12_4_ != auVar14._12_4_ || auVar21._8_4_ <= auVar14._8_4_) &&
              auVar21._12_4_ <= auVar14._12_4_) {
            ptVar6[uVar9 + 1] = fVar11;
          }
          auVar21 = (auVar18 | auVar3) ^ auVar5;
          iVar22 = auVar21._4_4_;
          if (iVar22 <= iVar16 && (iVar22 != iVar16 || auVar21._0_4_ <= auVar14._0_4_)) {
            ptVar6[uVar9 + 2] = fVar11;
            ptVar6[uVar9 + 3] = fVar11;
          }
          uVar9 = uVar9 + 4;
        } while ((uVar7 + 3 & 0xfffffffffffffffc) != uVar9);
        return;
      }
      optr->ex_type = 2;
      dVar12 = (double)(argv->ex_cont).v_flt;
LAB_0019feb4:
      __x = (double)argv[1].ex_cont.v_int;
      goto LAB_0019fedc;
    }
  }
  else {
    if (lVar8 != 1) {
      fmt = "expr: FUNC_EVAL(%d): bad left type %ld\n";
      goto LAB_0019faa2;
    }
    lVar8 = argv[1].ex_type;
    if (lVar8 - 0xeU < 2) {
      if (optr->ex_type != 0xf) {
        if (optr->ex_type == 0xe) goto LAB_0019fef8;
        optr->ex_type = 0xf;
        ptVar6 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar6;
      }
      iVar16 = e->exp_vsize;
      if (iVar16 == 0) {
        return;
      }
      lVar8 = (argv->ex_cont).v_int;
      ptVar6 = (optr->ex_cont).v_vec;
      ptVar2 = argv[1].ex_cont.v_vec;
      lVar10 = 0;
      do {
        dVar12 = atan2((double)lVar8,(double)ptVar2[lVar10]);
        ptVar6[lVar10] = (float)dVar12;
        lVar10 = lVar10 + 1;
      } while (iVar16 != (int)lVar10);
      return;
    }
    if (lVar8 == 2) {
      if (optr->ex_type == 0xf) {
        ptVar6 = (optr->ex_cont).v_vec;
        dVar12 = atan2((double)(argv->ex_cont).v_int,(double)argv[1].ex_cont.v_flt);
        auVar5 = _DAT_001b53a0;
        auVar4 = _DAT_001b5390;
        auVar3 = _DAT_001b5380;
        uVar7 = (ulong)(uint)e->exp_vsize;
        if (uVar7 == 0) {
          return;
        }
        fVar11 = (float)dVar12;
        lVar8 = uVar7 - 1;
        auVar15._8_4_ = (int)lVar8;
        auVar15._0_8_ = lVar8;
        auVar15._12_4_ = (int)((ulong)lVar8 >> 0x20);
        uVar9 = 0;
        auVar15 = auVar15 ^ _DAT_001b53a0;
        do {
          auVar19._8_4_ = (int)uVar9;
          auVar19._0_8_ = uVar9;
          auVar19._12_4_ = (int)(uVar9 >> 0x20);
          auVar21 = (auVar19 | auVar4) ^ auVar5;
          iVar16 = auVar15._4_4_;
          if ((bool)(~(auVar21._4_4_ == iVar16 && auVar15._0_4_ < auVar21._0_4_ ||
                      iVar16 < auVar21._4_4_) & 1)) {
            ptVar6[uVar9] = fVar11;
          }
          if ((auVar21._12_4_ != auVar15._12_4_ || auVar21._8_4_ <= auVar15._8_4_) &&
              auVar21._12_4_ <= auVar15._12_4_) {
            ptVar6[uVar9 + 1] = fVar11;
          }
          auVar21 = (auVar19 | auVar3) ^ auVar5;
          iVar22 = auVar21._4_4_;
          if (iVar22 <= iVar16 && (iVar22 != iVar16 || auVar21._0_4_ <= auVar15._0_4_)) {
            ptVar6[uVar9 + 2] = fVar11;
            ptVar6[uVar9 + 3] = fVar11;
          }
          uVar9 = uVar9 + 4;
        } while ((uVar7 + 3 & 0xfffffffffffffffc) != uVar9);
        return;
      }
      optr->ex_type = 2;
      dVar12 = (double)(argv->ex_cont).v_int;
      goto LAB_0019fed7;
    }
    if (lVar8 == 1) {
      if (optr->ex_type == 0xf) {
        ptVar6 = (optr->ex_cont).v_vec;
        dVar12 = atan2((double)(argv->ex_cont).v_int,(double)argv[1].ex_cont.v_int);
        auVar5 = _DAT_001b53a0;
        auVar4 = _DAT_001b5390;
        auVar3 = _DAT_001b5380;
        uVar7 = (ulong)(uint)e->exp_vsize;
        if (uVar7 == 0) {
          return;
        }
        fVar11 = (float)dVar12;
        lVar8 = uVar7 - 1;
        auVar13._8_4_ = (int)lVar8;
        auVar13._0_8_ = lVar8;
        auVar13._12_4_ = (int)((ulong)lVar8 >> 0x20);
        uVar9 = 0;
        auVar13 = auVar13 ^ _DAT_001b53a0;
        do {
          auVar17._8_4_ = (int)uVar9;
          auVar17._0_8_ = uVar9;
          auVar17._12_4_ = (int)(uVar9 >> 0x20);
          auVar21 = (auVar17 | auVar4) ^ auVar5;
          iVar16 = auVar13._4_4_;
          if ((bool)(~(auVar21._4_4_ == iVar16 && auVar13._0_4_ < auVar21._0_4_ ||
                      iVar16 < auVar21._4_4_) & 1)) {
            ptVar6[uVar9] = fVar11;
          }
          if ((auVar21._12_4_ != auVar13._12_4_ || auVar21._8_4_ <= auVar13._8_4_) &&
              auVar21._12_4_ <= auVar13._12_4_) {
            ptVar6[uVar9 + 1] = fVar11;
          }
          auVar21 = (auVar17 | auVar3) ^ auVar5;
          iVar22 = auVar21._4_4_;
          if (iVar22 <= iVar16 && (iVar22 != iVar16 || auVar21._0_4_ <= auVar13._0_4_)) {
            ptVar6[uVar9 + 2] = fVar11;
            ptVar6[uVar9 + 3] = fVar11;
          }
          uVar9 = uVar9 + 4;
        } while ((uVar7 + 3 & 0xfffffffffffffffc) != uVar9);
        return;
      }
      optr->ex_type = 2;
      dVar12 = (double)(argv->ex_cont).v_int;
      goto LAB_0019feb4;
    }
  }
  fmt = "expr: FUNC_EVAL(%d): bad right type %ld\n";
LAB_0019faa2:
  pd_error(e,fmt,0x315);
  return;
}

Assistant:

static void
ex_atan2(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        struct ex_ex *left, *right;
        t_float *op; /* output pointer */
        t_float *lp, *rp;         /* left and right vector pointers */
        t_float scalar;
        int j;

        left = argv++;
        right = argv;
        FUNC_EVAL(left, right, atan2, (double), (double), optr, 1);
}